

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcTessellationShaderIsolines.cpp
# Opt level: O0

void __thiscall glcts::TessellationShadersIsolines::deinit(TessellationShadersIsolines *this)

{
  TessellationShaderUtils *this_00;
  int iVar1;
  RenderContext *pRVar2;
  undefined4 extraout_var;
  Functions *gl;
  TessellationShadersIsolines *this_local;
  long lVar3;
  
  TestCaseBase::deinit(&this->super_TestCaseBase);
  if (((this->super_TestCaseBase).m_is_tessellation_shader_supported & 1U) != 0) {
    pRVar2 = deqp::Context::getRenderContext((this->super_TestCaseBase).m_context);
    iVar1 = (*pRVar2->_vptr_RenderContext[3])();
    lVar3 = CONCAT44(extraout_var,iVar1);
    (**(code **)(lVar3 + 0xfd8))((this->super_TestCaseBase).m_glExtTokens.PATCH_VERTICES,3);
    (**(code **)(lVar3 + 0x4e8))(0x8c89);
    (**(code **)(lVar3 + 0xd8))(0);
    if (this->m_utils_ptr != (TessellationShaderUtils *)0x0) {
      this_00 = this->m_utils_ptr;
      if (this_00 != (TessellationShaderUtils *)0x0) {
        TessellationShaderUtils::~TessellationShaderUtils(this_00);
        operator_delete(this_00,0x20);
      }
      this->m_utils_ptr = (TessellationShaderUtils *)0x0;
    }
    if (this->m_vao_id != 0) {
      (**(code **)(lVar3 + 0x490))(1,&this->m_vao_id);
      this->m_vao_id = 0;
    }
    std::
    map<glcts::_tessellation_shader_vertex_spacing,_std::vector<glcts::TessellationShadersIsolines::_test_descriptor,_std::allocator<glcts::TessellationShadersIsolines::_test_descriptor>_>,_std::less<glcts::_tessellation_shader_vertex_spacing>,_std::allocator<std::pair<const_glcts::_tessellation_shader_vertex_spacing,_std::vector<glcts::TessellationShadersIsolines::_test_descriptor,_std::allocator<glcts::TessellationShadersIsolines::_test_descriptor>_>_>_>_>
    ::clear(&this->m_tests);
  }
  return;
}

Assistant:

void TessellationShadersIsolines::deinit()
{
	/* Call base class' deinit() */
	TestCaseBase::deinit();

	if (!m_is_tessellation_shader_supported)
	{
		return;
	}

	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	/* Reset GL_PATCH_VERTICES_EXT to default value */
	gl.patchParameteri(m_glExtTokens.PATCH_VERTICES, 3);

	/* Disable GL_RASTERIZER_DISCARD mode */
	gl.disable(GL_RASTERIZER_DISCARD);

	/* Unbind vertex array object */
	gl.bindVertexArray(0);

	/* Release Utilities instance */
	if (m_utils_ptr != NULL)
	{
		delete m_utils_ptr;

		m_utils_ptr = DE_NULL;
	}

	if (m_vao_id != 0)
	{
		gl.deleteVertexArrays(1, &m_vao_id);

		m_vao_id = 0;
	}

	/* Free the data structures we allocated for the test */
	m_tests.clear();
}